

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void Process::Private::splitCommandLine(String *commandLine,List<String> *command)

{
  bool bVar1;
  char *local_48;
  char *p;
  String arg;
  List<String> *command_local;
  String *commandLine_local;
  
  arg._data.ref = (usize)command;
  String::String((String *)&p);
  local_48 = String::operator_cast_to_char_(commandLine);
  do {
    while( true ) {
      while( true ) {
        if (*local_48 == '\0') {
          bVar1 = String::isEmpty((String *)&p);
          if (!bVar1) {
            List<String>::append((List<String> *)arg._data.ref,(String *)&p);
          }
          String::~String((String *)&p);
          return;
        }
        if (*local_48 != ' ') break;
        List<String>::append((List<String> *)arg._data.ref,(String *)&p);
        String::clear((String *)&p);
        local_48 = local_48 + 1;
      }
      if (*local_48 == '\"') break;
      String::append((String *)&p,*local_48);
      local_48 = local_48 + 1;
    }
    local_48 = local_48 + 1;
    while (*local_48 != '\0') {
      if (*local_48 == '\"') {
        local_48 = local_48 + 1;
        break;
      }
      if (*local_48 == '\\') {
        if (local_48[1] == '\"') {
          String::append((String *)&p,'\"');
          local_48 = local_48 + 2;
        }
      }
      else {
        String::append((String *)&p,*local_48);
        local_48 = local_48 + 1;
      }
    }
  } while( true );
}

Assistant:

static void splitCommandLine(const String& commandLine, List<String>& command)
  {
    String arg;
    for (const char* p = commandLine; *p;)
      switch (*p)
      {
      case '"':
        for (++p; *p;)
        {
          switch (*p)
          {
          case '"':
            ++p;
            break;
          case '\\':
            if (p[1] == '"')
            {
              arg.append('"');
              p += 2;
            }
            continue;
          default:
            arg.append(*(p++));
            continue;
          }
          break;
        }
        break;
      case ' ':
        command.append(arg);
        arg.clear();
        ++p;
        break;
      default:
        arg.append(*(p++));
      }
    if (!arg.isEmpty())
      command.append(arg);
  }